

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O1

CURLcode Curl_add_buffer(Curl_send_buffer *in,void *inptr,size_t size)

{
  ulong uVar1;
  CURLcode CVar2;
  char *pcVar3;
  size_t size_00;
  
  uVar1 = in->size_used;
  if (CARRY8(size,uVar1)) {
    (*Curl_cfree)(in->buffer);
    in->buffer = (char *)0x0;
    (*Curl_cfree)(in);
LAB_00111280:
    CVar2 = CURLE_OUT_OF_MEMORY;
  }
  else {
    pcVar3 = in->buffer;
    if ((pcVar3 == (char *)0x0) || (in->size_max - 1 < size + uVar1)) {
      size_00 = 0xffffffffffffffff;
      if (-1 < (long)(uVar1 | size)) {
        if (!CARRY8(uVar1 * 2,size * 2)) {
          size_00 = (size + uVar1) * 2;
        }
      }
      if (pcVar3 == (char *)0x0) {
        pcVar3 = (char *)(*Curl_cmalloc)(size_00);
      }
      else {
        pcVar3 = (char *)Curl_saferealloc(pcVar3,size_00);
      }
      if (pcVar3 == (char *)0x0) {
        (*Curl_cfree)(in);
        goto LAB_00111280;
      }
      in->buffer = pcVar3;
      in->size_max = size_00;
    }
    memcpy(in->buffer + in->size_used,inptr,size);
    in->size_used = in->size_used + size;
    CVar2 = CURLE_OK;
  }
  return CVar2;
}

Assistant:

CURLcode Curl_add_buffer(Curl_send_buffer *in, const void *inptr, size_t size)
{
  char *new_rb;
  size_t new_size;

  if(~size < in->size_used) {
    /* If resulting used size of send buffer would wrap size_t, cleanup
       the whole buffer and return error. Otherwise the required buffer
       size will fit into a single allocatable memory chunk */
    Curl_safefree(in->buffer);
    free(in);
    return CURLE_OUT_OF_MEMORY;
  }

  if(!in->buffer ||
     ((in->size_used + size) > (in->size_max - 1))) {

    /* If current buffer size isn't enough to hold the result, use a
       buffer size that doubles the required size. If this new size
       would wrap size_t, then just use the largest possible one */

    if((size > (size_t)-1 / 2) || (in->size_used > (size_t)-1 / 2) ||
       (~(size * 2) < (in->size_used * 2)))
      new_size = (size_t)-1;
    else
      new_size = (in->size_used+size) * 2;

    if(in->buffer)
      /* we have a buffer, enlarge the existing one */
      new_rb = Curl_saferealloc(in->buffer, new_size);
    else
      /* create a new buffer */
      new_rb = malloc(new_size);

    if(!new_rb) {
      /* If we failed, we cleanup the whole buffer and return error */
      free(in);
      return CURLE_OUT_OF_MEMORY;
    }

    in->buffer = new_rb;
    in->size_max = new_size;
  }
  memcpy(&in->buffer[in->size_used], inptr, size);

  in->size_used += size;

  return CURLE_OK;
}